

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

pair<int,_int> __thiscall
Lodtalk::InstanceVariableScope::findInstanceVariable
          (InstanceVariableScope *this,ClassDescription *pos,Oop symbol)

{
  ClassDescription *pos_00;
  pair<int,_int> pVar1;
  undefined8 *puVar2;
  size_t i;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  Oop instanceVarNames;
  anon_union_8_4_0eb573b0_for_Oop_0 local_28;
  
  pos_00 = (ClassDescription *)(pos->super_Behavior).superclass;
  if (pos_00 == (ClassDescription *)&NilObject) {
    uVar5 = 0;
  }
  else {
    pVar1 = findInstanceVariable(this,pos_00,symbol);
    if (-1 < pVar1.first) {
      uVar5 = (ulong)pVar1 & 0xffffffff00000000;
      goto LAB_00143300;
    }
    uVar5 = (ulong)pVar1 >> 0x20;
  }
  pVar1.first = -1;
  pVar1.second = 0;
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)(pos->instanceVariables).field_0.uintValue;
  if (local_28.pointer != (uint8_t *)&NilObject) {
    puVar2 = (undefined8 *)Oop::getNumberOfElements((Oop *)&local_28);
    puVar3 = (undefined8 *)0x0;
    puVar4 = (undefined8 *)(local_28.uintValue + 8);
    if ((local_28.uintValue & 7) != 0) {
      puVar4 = puVar3;
    }
    for (; puVar2 != puVar3; puVar3 = (undefined8 *)((long)puVar3 + 1)) {
      if ((anon_union_8_4_0eb573b0_for_Oop_0)
          ((anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar4 + (long)puVar3))->pointer == symbol.field_0)
      {
        pVar1.first = (int)puVar3 + (int)uVar5;
        pVar1.second = 0;
        break;
      }
    }
    uVar5 = (ulong)(uint)((int)uVar5 + (int)puVar2);
  }
  uVar5 = uVar5 << 0x20;
LAB_00143300:
  return (pair<int,_int>)((ulong)pVar1 & 0xffffffff | uVar5);
}

Assistant:

std::pair<int, int> InstanceVariableScope::findInstanceVariable(ClassDescription *pos, Oop symbol)
{
	// Find the superclass first
	auto instanceCount = 0;
	auto super = pos->superclass;
	if(!isNil(super))
	{
		auto superInstance = findInstanceVariable(reinterpret_cast<ClassDescription*> (super), symbol);
		if(superInstance.first >= 0)
			return superInstance;
		instanceCount = superInstance.second;
	}

	// Find the symbol here
	auto instanceVarNames = pos->instanceVariables;
	auto instanceVarIndex = -1;
	if(!instanceVarNames.isNil())
	{
		size_t count = instanceVarNames.getNumberOfElements();
		auto nameArray = reinterpret_cast<Oop*> (instanceVarNames.getFirstFieldPointer());
		for(size_t i = 0; i < count; ++i)
		{
			if(nameArray[i] == symbol)
			{
				instanceVarIndex = (int)i + instanceCount;
				break;
			}
		}
		instanceCount += (int)count;
	}

	return std::make_pair(instanceVarIndex, instanceCount);
}